

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_c74::min::message_type_&,_const_c74::min::message_type_&> * __thiscall
Catch::ExprLhs<c74::min::message_type_const&>::operator==
          (BinaryExpr<const_c74::min::message_type_&,_const_c74::min::message_type_&>
           *__return_storage_ptr__,ExprLhs<c74::min::message_type_const&> *this,message_type *rhs)

{
  message_type *pmVar1;
  message_type mVar2;
  message_type mVar3;
  StringRef local_40;
  
  pmVar1 = *(message_type **)this;
  mVar2 = *pmVar1;
  mVar3 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = mVar2 == mVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00196990;
  __return_storage_ptr__->m_lhs = pmVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }